

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::insertAction(QGraphicsWidget *this,QAction *before,QAction *action)

{
  QList<QAction_*> *vector;
  long lVar1;
  int iVar2;
  ulong uVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *pcStack_40;
  QAction *action_local;
  QAction *before_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  action_local = action;
  before_local = before;
  if (action == (QAction *)0x0) {
    local_58 = 2;
    uStack_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = 0;
    pcStack_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,"QWidget::insertAction: Attempt to insert null action");
  }
  else {
    lVar1 = *(long *)(this + 0x18);
    vector = (QList<QAction_*> *)(lVar1 + 0x1f0);
    uVar3 = QtPrivate::indexOf<QAction*,QAction*>(vector,&action_local,0);
    if ((uVar3 & 0xffffffff) != 0xffffffff) {
      QList<QAction_*>::removeAt(vector,(long)(int)uVar3);
    }
    qVar4 = QtPrivate::indexOf<QAction*,QAction*>(vector,&before_local,0);
    iVar2 = (int)qVar4;
    if (iVar2 < 0) {
      before_local = (QAction *)0x0;
      iVar2 = (int)*(undefined8 *)(lVar1 + 0x200);
    }
    QList<QAction_*>::insert(vector,(long)iVar2,action_local);
    if ((int)uVar3 == -1) {
      QList<QObject_*>::append
                ((QList<QObject_*> *)(*(long *)(action_local + 8) + 0x140),(parameter_type)this);
    }
    local_48 = 0xaaaaaaaa;
    uStack_44 = 0xaaaaaaaa;
    pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    QActionEvent::QActionEvent((QActionEvent *)&local_58,0x72,action_local,before_local);
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_58);
    QActionEvent::~QActionEvent((QActionEvent *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::insertAction(QAction *before, QAction *action)
{
    if (!action) {
        qWarning("QWidget::insertAction: Attempt to insert null action");
        return;
    }

    Q_D(QGraphicsWidget);
    int index = d->actions.indexOf(action);
    if (index != -1)
        d->actions.removeAt(index);

    int pos = d->actions.indexOf(before);
    if (pos < 0) {
        before = nullptr;
        pos = d->actions.size();
    }
    d->actions.insert(pos, action);

    if (index == -1) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.append(this);
    }

    QActionEvent e(QEvent::ActionAdded, action, before);
    QCoreApplication::sendEvent(this, &e);
}